

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O1

void * index_tree_locate(index_tree *tree,lzma_vli target)

{
  index_tree_node *piVar1;
  index_tree_node *piVar2;
  
  piVar2 = tree->root;
  if ((tree->leftmost != (index_tree_node *)0x0) && (tree->leftmost->uncompressed_base != 0)) {
    __assert_fail("tree->leftmost == NULL || tree->leftmost->uncompressed_base == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                  ,0x145,"void *index_tree_locate(const index_tree *, lzma_vli)");
  }
  piVar1 = (index_tree_node *)0x0;
  for (; piVar2 != (index_tree_node *)0x0;
      piVar2 = (&piVar2->left)[piVar2->uncompressed_base <= target]) {
    if (piVar2->uncompressed_base <= target) {
      piVar1 = piVar2;
    }
  }
  return piVar1;
}

Assistant:

static void *
index_tree_locate(const index_tree *tree, lzma_vli target)
{
	const index_tree_node *result = NULL;
	const index_tree_node *node = tree->root;

	assert(tree->leftmost == NULL
			|| tree->leftmost->uncompressed_base == 0);

	// Consecutive nodes may have the same uncompressed_base.
	// We must pick the rightmost one.
	while (node != NULL) {
		if (node->uncompressed_base > target) {
			node = node->left;
		} else {
			result = node;
			node = node->right;
		}
	}

	return (void *)(result);
}